

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O3

void __thiscall VmConstant::~VmConstant(VmConstant *this)

{
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_003e8ca8;
  SmallArray<VmValue_*,_8U>::~SmallArray(&(this->super_VmValue).users);
  operator_delete(this,0xd8);
  return;
}

Assistant:

VmConstant(Allocator *allocator, VmType type, SynBase *source): VmValue(myTypeID, allocator, type, source)
	{
		iValue = 0;
		dValue = 0.0;
		lValue = 0ll;
		sValue = NULL;
		bValue = NULL;
		fValue = NULL;

		container = NULL;

		isFloat = false;
		isReference = false;
	}